

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void sbs_compare(sbs_t *sbs)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t *__s;
  uint64_t uVar4;
  uint32_t *ans;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  
  uVar13 = (ulong)sbs->size;
  if (uVar13 == 0) {
    uVar8 = 0;
  }
  else {
    uVar6 = 0;
    uVar8 = 0;
    do {
      for (uVar7 = sbs->words[uVar6]; uVar7 != 0; uVar7 = uVar7 & uVar7 - 1) {
        uVar8 = uVar8 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar13);
  }
  sVar12 = (ulong)uVar8 * 4;
  __s = (uint32_t *)malloc(sVar12);
  uVar6 = 0;
  memset(__s,0,sVar12);
  if (uVar13 != 0) {
    puVar1 = sbs->words;
    iVar5 = 0;
    uVar7 = 0;
    do {
      uVar2 = puVar1[uVar7];
      uVar9 = 0;
      uVar11 = uVar6;
      do {
        uVar6 = uVar11;
        if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
          uVar6 = (ulong)((int)uVar11 + 1);
          __s[uVar11] = iVar5 + (int)uVar9;
        }
        uVar9 = uVar9 + 1;
        uVar11 = uVar6;
      } while (uVar9 != 0x40);
      uVar7 = uVar7 + 1;
      iVar5 = iVar5 + 0x40;
    } while (uVar7 != uVar13);
  }
  uVar4 = roaring_bitmap_get_cardinality(sbs->roaring);
  uVar10 = (uint)uVar4;
  sVar12 = (uVar4 & 0xffffffff) << 2;
  ans = (uint32_t *)malloc(sVar12);
  uVar3 = 0;
  memset(ans,0,sVar12);
  roaring_bitmap_to_uint32_array(sbs->roaring,ans);
  if ((uVar8 == uVar10) && (uVar3 = (uint)((int)uVar10 < 1), 0 < (int)uVar10)) {
    if (*ans == *__s) {
      uVar13 = 1;
      do {
        uVar6 = uVar13;
        if ((uVar10 & 0x7fffffff) == uVar6) break;
        uVar13 = uVar6 + 1;
      } while (ans[uVar6] == __s[uVar6]);
      uVar3 = (uint)((uVar10 & 0x7fffffff) <= uVar6);
    }
    else {
      uVar3 = 0;
    }
  }
  if (uVar3 == 0) {
    printf("Expected: ");
    if (uVar8 != 0) {
      uVar13 = 0;
      do {
        printf("%u ",(ulong)__s[uVar13]);
        uVar13 = uVar13 + 1;
      } while (uVar8 != uVar13);
    }
    putchar(10);
    printf("Actual: ");
    roaring_bitmap_printf(sbs->roaring);
    putchar(10);
  }
  free(ans);
  free(__s);
  _assert_true((ulong)uVar3,"ok",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x21c);
  return;
}

Assistant:

void sbs_compare(sbs_t *sbs) {
    uint32_t expected_cardinality = 0;
    for (uint32_t i = 0; i < sbs->size; i++) {
        uint64_t word = sbs->words[i];
        while (word != 0) {
            expected_cardinality += 1;
            word = word & (word - 1);
        }
    }
    uint32_t *expected_values =
        (uint32_t *)malloc(expected_cardinality * sizeof(uint32_t));
    memset(expected_values, 0, expected_cardinality * sizeof(uint32_t));
    for (uint32_t i = 0, dst = 0; i < sbs->size; i++) {
        for (uint32_t j = 0; j < 64; j++) {
            if ((sbs->words[i] & (UINT64_C(1) << j)) != 0) {
                expected_values[dst++] = i * 64 + j;
            }
        }
    }

    uint32_t actual_cardinality = roaring_bitmap_get_cardinality(sbs->roaring);
    uint32_t *actual_values =
        (uint32_t *)malloc(actual_cardinality * sizeof(uint32_t));
    memset(actual_values, 0, actual_cardinality * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(sbs->roaring, actual_values);

    bool ok = array_equals(actual_values, actual_cardinality, expected_values,
                           expected_cardinality);
    if (!ok) {
        printf("Expected: ");
        for (uint32_t i = 0; i < expected_cardinality; i++) {
            printf("%u ", expected_values[i]);
        }
        printf("\n");

        printf("Actual: ");
        roaring_bitmap_printf(sbs->roaring);
        printf("\n");
    }
    free(actual_values);
    free(expected_values);
    assert_true(ok);
}